

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O2

bool __thiscall
SphereTriangleDetector::pointInTriangle
          (SphereTriangleDetector *this,cbtVector3 *vertices,cbtVector3 *normal,cbtVector3 *p)

{
  cbtVector3 *v1;
  cbtVector3 *v1_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar15 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar26 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  cbtVector3 cVar30;
  cbtVector3 cVar31;
  cbtVector3 cVar32;
  cbtVector3 cVar33;
  cbtVector3 cVar34;
  cbtVector3 cVar35;
  cbtVector3 edge2;
  cbtVector3 edge1;
  cbtVector3 edge3;
  cbtScalar local_98;
  cbtScalar local_88;
  cbtScalar local_78;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar16 [56];
  undefined1 auVar17 [56];
  undefined1 auVar18 [56];
  undefined1 auVar19 [56];
  
  auVar26 = in_ZMM1._8_56_;
  auVar14 = in_ZMM0._8_56_;
  v1 = vertices + 1;
  v1_00 = vertices + 2;
  cVar30 = ::operator-(v1,vertices);
  auVar20._0_8_ = cVar30.m_floats._8_8_;
  auVar20._8_56_ = auVar26;
  auVar5._0_8_ = cVar30.m_floats._0_8_;
  auVar5._8_56_ = auVar14;
  local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar20._0_16_);
  auVar14 = ZEXT856(local_50.m_floats._8_8_);
  cVar30 = ::operator-(v1_00,v1);
  auVar21._0_8_ = cVar30.m_floats._8_8_;
  auVar21._8_56_ = auVar26;
  auVar6._0_8_ = cVar30.m_floats._0_8_;
  auVar6._8_56_ = auVar14;
  local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar21._0_16_);
  auVar14 = ZEXT856(local_60.m_floats._8_8_);
  cVar30 = ::operator-(vertices,v1_00);
  auVar22._0_8_ = cVar30.m_floats._8_8_;
  auVar22._8_56_ = auVar26;
  auVar7._0_8_ = cVar30.m_floats._0_8_;
  auVar7._8_56_ = auVar14;
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar22._0_16_);
  auVar15 = ZEXT856(local_40.m_floats._8_8_);
  cVar30 = ::operator-(p,vertices);
  auVar8._0_8_ = cVar30.m_floats._0_8_;
  auVar8._8_56_ = auVar15;
  auVar14 = auVar15;
  cVar31 = ::operator-(p,v1);
  auVar9._0_8_ = cVar31.m_floats._0_8_;
  auVar9._8_56_ = auVar14;
  auVar16 = auVar14;
  cVar32 = ::operator-(p,v1_00);
  auVar10._0_8_ = cVar32.m_floats._0_8_;
  auVar10._8_56_ = auVar16;
  auVar17 = auVar16;
  cVar33 = cbtVector3::cross(&local_50,normal);
  auVar23._0_8_ = cVar33.m_floats._8_8_;
  auVar23._8_56_ = auVar26;
  auVar11._0_8_ = cVar33.m_floats._0_8_;
  auVar11._8_56_ = auVar17;
  auVar18 = auVar17;
  cVar34 = cbtVector3::cross(&local_60,normal);
  auVar24._0_8_ = cVar34.m_floats._8_8_;
  auVar24._8_56_ = auVar26;
  auVar12._0_8_ = cVar34.m_floats._0_8_;
  auVar12._8_56_ = auVar18;
  auVar19 = auVar18;
  cVar35 = cbtVector3::cross(&local_40,normal);
  auVar25._0_8_ = cVar35.m_floats._8_8_;
  auVar25._8_56_ = auVar26;
  auVar13._0_8_ = cVar35.m_floats._0_8_;
  auVar13._8_56_ = auVar19;
  auVar27._0_4_ = cVar30.m_floats[0] * cVar33.m_floats[0];
  auVar27._4_4_ = cVar30.m_floats[1] * cVar33.m_floats[1];
  auVar27._8_4_ = auVar15._0_4_ * auVar17._0_4_;
  auVar27._12_4_ = auVar15._4_4_ * auVar17._4_4_;
  auVar27 = vmovshdup_avx(auVar27);
  auVar27 = vfmadd231ss_fma(auVar27,auVar11._0_16_,auVar8._0_16_);
  local_78 = cVar30.m_floats[2];
  auVar3 = vfmadd231ss_fma(auVar27,auVar23._0_16_,ZEXT416((uint)local_78));
  auVar28._0_4_ = cVar31.m_floats[0] * cVar34.m_floats[0];
  auVar28._4_4_ = cVar31.m_floats[1] * cVar34.m_floats[1];
  auVar28._8_4_ = auVar14._0_4_ * auVar18._0_4_;
  auVar28._12_4_ = auVar14._4_4_ * auVar18._4_4_;
  auVar27 = vmovshdup_avx(auVar28);
  auVar27 = vfmadd231ss_fma(auVar27,auVar12._0_16_,auVar9._0_16_);
  local_88 = cVar31.m_floats[2];
  auVar28 = vfmadd231ss_fma(auVar27,auVar24._0_16_,ZEXT416((uint)local_88));
  auVar29._0_4_ = cVar32.m_floats[0] * cVar35.m_floats[0];
  auVar29._4_4_ = cVar32.m_floats[1] * cVar35.m_floats[1];
  auVar29._8_4_ = auVar16._0_4_ * auVar19._0_4_;
  auVar29._12_4_ = auVar16._4_4_ * auVar19._4_4_;
  auVar27 = vmovshdup_avx(auVar29);
  auVar27 = vfmadd231ss_fma(auVar27,auVar13._0_16_,auVar10._0_16_);
  local_98 = cVar32.m_floats[2];
  auVar27 = vfmadd231ss_fma(auVar27,auVar25._0_16_,ZEXT416((uint)local_98));
  if (((auVar3._0_4_ <= 0.0) || (auVar28._0_4_ <= 0.0)) || (bVar4 = true, auVar27._0_4_ <= 0.0)) {
    uVar1 = vcmpps_avx512vl(auVar3,ZEXT816(0) << 0x40,2);
    uVar2 = vcmpps_avx512vl(auVar28,ZEXT816(0) << 0x40,2);
    bVar4 = (bool)(auVar27._0_4_ <= 0.0 & (byte)uVar1 & (byte)uVar2);
  }
  return bVar4;
}

Assistant:

bool SphereTriangleDetector::pointInTriangle(const cbtVector3 vertices[], const cbtVector3& normal, cbtVector3* p)
{
	const cbtVector3* p1 = &vertices[0];
	const cbtVector3* p2 = &vertices[1];
	const cbtVector3* p3 = &vertices[2];

	cbtVector3 edge1(*p2 - *p1);
	cbtVector3 edge2(*p3 - *p2);
	cbtVector3 edge3(*p1 - *p3);

	cbtVector3 p1_to_p(*p - *p1);
	cbtVector3 p2_to_p(*p - *p2);
	cbtVector3 p3_to_p(*p - *p3);

	cbtVector3 edge1_normal(edge1.cross(normal));
	cbtVector3 edge2_normal(edge2.cross(normal));
	cbtVector3 edge3_normal(edge3.cross(normal));

	cbtScalar r1, r2, r3;
	r1 = edge1_normal.dot(p1_to_p);
	r2 = edge2_normal.dot(p2_to_p);
	r3 = edge3_normal.dot(p3_to_p);
	if ((r1 > 0 && r2 > 0 && r3 > 0) ||
		(r1 <= 0 && r2 <= 0 && r3 <= 0))
		return true;
	return false;
}